

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O3

void work_mgga_exc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined8 uVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  double __x;
  double dVar73;
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  double dVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  double local_1f8;
  double local_1e0;
  double local_1b8;
  double local_198;
  double local_158;
  double local_118;
  
  if (np != 0) {
    local_118 = 0.0;
    sVar9 = 0;
    local_158 = 0.0;
    local_1e0 = 0.0;
    __x = 0.0;
    do {
      iVar1 = p->nspin;
      lVar7 = (long)(p->dim).rho * sVar9;
      dVar15 = rho[lVar7];
      if (iVar1 == 2) {
        dVar15 = dVar15 + rho[lVar7 + 1];
      }
      dVar26 = p->dens_threshold;
      if (dVar26 <= dVar15) {
        dVar15 = rho[lVar7];
        if (rho[lVar7] <= dVar26) {
          dVar15 = dVar26;
        }
        dVar16 = p->sigma_threshold * p->sigma_threshold;
        lVar8 = (long)(p->dim).sigma * sVar9;
        local_1b8 = sigma[lVar8];
        if (sigma[lVar8] <= dVar16) {
          local_1b8 = dVar16;
        }
        uVar2 = p->info->flags;
        if ((uVar2 >> 0x10 & 1) == 0) {
          if (iVar1 == 2) {
            __x = rho[lVar7 + 1];
            if (rho[lVar7 + 1] <= dVar26) {
              __x = dVar26;
            }
            local_1e0 = sigma[lVar8 + 2];
            if (sigma[lVar8 + 2] <= dVar16) {
              local_1e0 = dVar16;
            }
          }
        }
        else {
          dVar20 = p->tau_threshold;
          lVar10 = (long)(p->dim).tau * sVar9;
          local_158 = tau[lVar10];
          if (tau[lVar10] <= dVar20) {
            local_158 = dVar20;
          }
          if (((uVar2 >> 0x11 & 1) != 0) && (dVar17 = dVar15 * 8.0 * local_158, dVar17 <= local_1b8)
             ) {
            local_1b8 = dVar17;
          }
          if (iVar1 == 2) {
            __x = rho[lVar7 + 1];
            if (rho[lVar7 + 1] <= dVar26) {
              __x = dVar26;
            }
            local_1e0 = sigma[lVar8 + 2];
            if (sigma[lVar8 + 2] <= dVar16) {
              local_1e0 = dVar16;
            }
            local_118 = tau[lVar10 + 1];
            if (tau[lVar10 + 1] <= dVar20) {
              local_118 = dVar20;
            }
            if (((uVar2 >> 0x11 & 1) != 0) && (dVar16 = __x * 8.0 * local_118, dVar16 <= local_1e0))
            {
              local_1e0 = dVar16;
            }
          }
        }
        dVar70 = 1.0 / (dVar15 + __x);
        dVar16 = p->zeta_threshold;
        dVar33 = dVar16 + -1.0;
        dVar74 = (__x + __x) * dVar70;
        dVar81 = -dVar33;
        dVar73 = (dVar15 - __x) * dVar70;
        uVar11 = -(ulong)(dVar74 <= dVar16);
        uVar12 = -(ulong)((dVar15 + dVar15) * dVar70 <= dVar16);
        dVar46 = (double)(uVar12 & (ulong)dVar33 |
                         ~uVar12 & (~uVar11 & (ulong)dVar73 | uVar11 & (ulong)dVar81)) + 1.0;
        dVar17 = cbrt(dVar16);
        dVar18 = cbrt(dVar46);
        dVar19 = cbrt(dVar15 + __x);
        dVar20 = cbrt(9.0);
        dVar21 = cbrt(0.3183098861837907);
        dVar34 = (1.0 / dVar19) * 1.4422495703074083 *
                 dVar21 * dVar21 * dVar20 * dVar20 * p->cam_omega;
        dVar21 = cbrt(9.869604401089358);
        dVar22 = 1.0 / (dVar21 * dVar21);
        dVar23 = dVar22 * 1.8171205928321397;
        dVar35 = dVar15 * dVar15;
        dVar20 = cbrt(dVar15);
        dVar54 = 1.0 / (dVar20 * dVar20);
        dVar55 = (dVar54 / dVar35) * local_1b8;
        dVar47 = ((1.0 / dVar21) / 9.869604401089358) * 3.3019272488946267 * 0.002689949046226295;
        dVar61 = local_1b8 * local_1b8 * dVar47 * ((1.0 / dVar20) / (dVar35 * dVar35 * dVar15)) +
                 dVar23 * 0.1504548888888889 * dVar55 + 1.0;
        dVar35 = pow(dVar61,0.1);
        dVar20 = p->zeta_threshold;
        uVar11 = -(ulong)(1.0 - dVar73 <= dVar20);
        uVar13 = -(ulong)(dVar73 + 1.0 <= dVar20);
        dVar24 = (double)(~uVar13 & (uVar11 & (ulong)dVar81 | ~uVar11 & (ulong)dVar73) |
                         uVar13 & (ulong)dVar33) + 1.0;
        dVar25 = cbrt(dVar24);
        uVar14 = -(ulong)(dVar24 <= dVar20);
        auVar27._8_8_ = uVar14 & (ulong)dVar17 | ~uVar14 & (ulong)dVar25;
        auVar27._0_8_ = dVar35;
        auVar27 = divpd(_DAT_00f54940,auVar27);
        dVar35 = (auVar27._8_8_ * auVar27._0_8_ * dVar34) / 18.0;
        dVar20 = 1e-10;
        if (1e-10 <= dVar35) {
          dVar20 = dVar35;
        }
        dVar35 = 1.35;
        if (dVar20 <= 1.35) {
          dVar35 = dVar20;
        }
        dVar24 = erf((1.0 / dVar35) * 0.5);
        dVar25 = exp((-1.0 / (dVar35 * dVar35)) * 0.25);
        if (1.35 <= dVar20) {
          dVar35 = dVar20;
          if (dVar20 <= 1.35) {
            dVar35 = 1.35;
          }
          auVar84._0_8_ = dVar35 * dVar35;
          dVar35 = auVar84._0_8_ * auVar84._0_8_;
          auVar84._8_8_ = dVar35;
          dVar24 = dVar35 * dVar35;
          auVar90._0_8_ = auVar84._0_8_ * dVar35;
          auVar90._8_8_ = dVar24 * dVar24;
          auVar27 = divpd(_DAT_00f54940,auVar84);
          auVar95 = divpd(auVar27,_DAT_00f60be0);
          auVar78._8_8_ = dVar24;
          auVar78._0_8_ = auVar90._0_8_;
          auVar78 = divpd(_DAT_00f54940,auVar78);
          uVar69 = auVar78._8_8_;
          auVar68._8_8_ = 0x3ff0000000000000;
          auVar68._0_8_ = uVar69;
          auVar27 = divpd(auVar68,auVar90);
          auVar85._8_8_ = uVar69;
          auVar85._0_8_ = uVar69;
          auVar84 = divpd(auVar85,auVar84);
          auVar68 = divpd(auVar78,_DAT_00f60bf0);
          auVar84 = divpd(auVar84,_DAT_00f60c00);
          auVar27 = divpd(auVar27,_DAT_00f60c10);
          local_1f8 = ((((((auVar95._0_8_ - auVar95._8_8_) + auVar68._0_8_) - auVar68._8_8_) +
                        auVar84._0_8_) - auVar84._8_8_) + auVar27._0_8_) - auVar27._8_8_;
        }
        else {
          local_1f8 = dVar35 * -2.6666666666666665 *
                      (dVar24 * 1.7724538509055159 +
                      (dVar25 + -1.5 + (dVar25 + -1.0) * dVar35 * dVar35 * -2.0) * (dVar35 + dVar35)
                      ) + 1.0;
        }
        dVar24 = pow(dVar61,0.2);
        dVar35 = 0.27;
        if (dVar20 <= 0.27) {
          dVar35 = dVar20;
        }
        dVar36 = dVar35 * dVar35;
        dVar25 = exp((-1.0 / dVar36) * 0.25);
        dVar61 = erf((1.0 / dVar35) * 0.5);
        if (0.27 <= dVar20) {
          dVar35 = dVar20;
          if (dVar20 <= 0.27) {
            dVar35 = 0.27;
          }
          auVar48._0_8_ = dVar35 * dVar35;
          auVar38._0_8_ = auVar48._0_8_ * auVar48._0_8_;
          auVar98._0_8_ = auVar48._0_8_ * auVar38._0_8_;
          auVar98._8_8_ = auVar38._0_8_ * auVar38._0_8_;
          auVar62._0_8_ = auVar38._0_8_ * auVar98._8_8_;
          auVar62._8_8_ = auVar98._0_8_ * auVar98._8_8_;
          dVar35 = auVar98._8_8_ * auVar98._8_8_;
          auVar71._0_8_ = auVar48._0_8_ * auVar98._8_8_;
          auVar71._8_8_ = auVar48._0_8_ * dVar35;
          auVar86._0_8_ = 1.0 / (dVar35 * dVar35);
          auVar56._8_8_ = 0x3ff0000000000000;
          auVar56._0_8_ = auVar86._0_8_;
          auVar93._8_8_ = 0x3ff0000000000000;
          auVar93._0_8_ = auVar86._0_8_;
          auVar95._8_8_ = dVar35;
          auVar95._0_8_ = auVar98._8_8_;
          auVar68 = divpd(auVar93,auVar95);
          dVar35 = auVar68._8_8_;
          auVar100._0_8_ = -dVar35;
          auVar100._8_8_ = dVar35;
          auVar27 = divpd(auVar100,auVar98);
          auVar95 = divpd(auVar27,_DAT_00fc3020);
          auVar91._8_8_ = auVar71._0_8_;
          auVar91._0_8_ = auVar62._0_8_;
          auVar99._8_8_ = dVar35;
          auVar99._0_8_ = dVar35;
          auVar27 = divpd(auVar99,auVar91);
          auVar100 = divpd(auVar27,_DAT_00fc3030);
          auVar92._8_8_ = dVar35 / auVar62._8_8_;
          auVar92._0_8_ = auVar86._0_8_;
          auVar93 = divpd(auVar92,_DAT_00fc3040);
          auVar86._8_8_ = auVar86._0_8_;
          auVar27 = divpd(auVar86,auVar62);
          auVar90 = divpd(auVar27,_DAT_00fc3050);
          auVar48._8_8_ = auVar71._0_8_;
          auVar79._8_8_ = 0x3ff0000000000000;
          auVar79._0_8_ = auVar86._0_8_;
          auVar27 = divpd(auVar79,auVar48);
          auVar85 = divpd(auVar27,_DAT_00fc3060);
          auVar38._8_8_ = auVar62._0_8_;
          auVar49._8_8_ = 0x3ff0000000000000;
          auVar49._0_8_ = auVar86._0_8_;
          auVar27 = divpd(auVar49,auVar38);
          auVar84 = divpd(auVar27,_DAT_00fc3070);
          auVar63._8_8_ = auVar62._8_8_;
          auVar63._0_8_ = auVar98._0_8_;
          auVar102._8_8_ = 0x3ff0000000000000;
          auVar102._0_8_ = auVar86._0_8_;
          auVar27 = divpd(auVar102,auVar63);
          auVar27 = divpd(auVar27,_DAT_00fc3080);
          auVar78 = divpd(auVar68,_DAT_00fc3090);
          auVar68 = divpd(auVar56,auVar71);
          auVar68 = divpd(auVar68,_DAT_00fc30a0);
          local_1b8 = auVar68._8_8_ +
                      auVar78._8_8_ +
                      auVar27._8_8_ +
                      auVar84._8_8_ +
                      auVar85._8_8_ +
                      (1.0 / auVar98._8_8_) * 3.804788961038961e-06 +
                      (1.0 / auVar98._0_8_) / -11520.0 +
                      0.0013392857142857143 / auVar38._0_8_ + (auVar90._0_8_ - auVar90._8_8_) +
                      (dVar35 / auVar38._0_8_) / 927028425523200.0 +
                      auVar68._0_8_ +
                      auVar78._0_8_ +
                      auVar27._0_8_ +
                      auVar84._0_8_ +
                      auVar85._0_8_ +
                      ((((auVar95._8_8_ + auVar95._0_8_) - auVar100._8_8_) + auVar100._0_8_) -
                      auVar93._8_8_) + auVar93._0_8_;
        }
        else {
          dVar37 = dVar36 * dVar36 * 64.0;
          local_1b8 = dVar36 * 24.0 *
                      (dVar36 * -36.0 +
                       dVar35 * 17.724538509055158 * dVar61 + (dVar36 * 20.0 - dVar37) * dVar25 +
                       dVar37 + -3.0) + 1.0;
        }
        dVar35 = dVar21 * dVar21 * 0.14417005510442776;
        dVar21 = 0.32;
        if (dVar20 <= 0.32) {
          dVar21 = dVar20;
        }
        dVar36 = dVar21 * dVar21;
        dVar25 = exp((-1.0 / dVar36) * 0.25);
        dVar61 = erf((1.0 / dVar21) * 0.5);
        if (0.32 <= dVar20) {
          if (dVar20 <= 0.32) {
            dVar20 = 0.32;
          }
          dVar20 = dVar20 * dVar20;
          dVar21 = dVar20 * dVar20;
          dVar25 = dVar20 * dVar21;
          auVar28._8_8_ = dVar25;
          auVar28._0_8_ = dVar21;
          auVar39._0_8_ = dVar21 * dVar21;
          dVar61 = auVar39._0_8_ * auVar39._0_8_;
          auVar64._0_8_ = 1.0 / dVar61;
          auVar64._8_8_ = auVar64._0_8_;
          auVar82._8_8_ = auVar64._0_8_;
          auVar82._0_8_ = auVar64._0_8_;
          auVar87._8_8_ = auVar64._0_8_;
          auVar87._0_8_ = auVar64._0_8_;
          auVar6._8_8_ = auVar39._0_8_ * dVar25;
          auVar6._0_8_ = auVar39._0_8_ * dVar21;
          auVar27 = divpd(auVar64,auVar6);
          auVar75._8_8_ = auVar64._0_8_ / dVar20;
          auVar75._0_8_ = auVar64._0_8_;
          auVar78 = divpd(auVar75,_DAT_00fc30b0);
          auVar84 = divpd(auVar82,auVar28);
          auVar85 = divpd(auVar84,_DAT_00fc30c0);
          auVar39._8_8_ = dVar20 * auVar39._0_8_;
          auVar84 = divpd(auVar87,auVar39);
          auVar90 = divpd(auVar84,_DAT_00fc30d0);
          auVar68 = divpd(auVar27,_DAT_00fc30e0);
          auVar40._0_8_ = 1.0 / (dVar61 * dVar61);
          auVar57._8_8_ = auVar40._0_8_ / dVar20;
          auVar57._0_8_ = auVar40._0_8_;
          auVar84 = divpd(auVar57,_DAT_00fc30f0);
          auVar40._8_8_ = auVar40._0_8_;
          auVar27 = divpd(auVar40,auVar28);
          auVar27 = divpd(auVar27,_DAT_00fc3100);
          dVar20 = ((((((((((((1.0 / (auVar39._0_8_ * dVar25)) / -115811942400.0 +
                              (1.0 / (auVar39._0_8_ * dVar21)) / 2530344960.0 +
                              (1.0 / (dVar20 * auVar39._0_8_)) / -61501440.0 +
                              (1.0 / auVar39._0_8_) * 5.871587902837903e-07 +
                              (1.0 / dVar25) / -56448.0 + 0.0003826530612244898 / dVar21 +
                             auVar78._0_8_) - auVar78._8_8_) + auVar85._0_8_) - auVar85._8_8_) +
                         auVar90._0_8_) - auVar90._8_8_) + auVar68._0_8_) - auVar68._8_8_) +
                     auVar84._0_8_) - auVar84._8_8_) + auVar27._0_8_) - auVar27._8_8_;
        }
        else {
          dVar20 = dVar36 * dVar36;
          dVar37 = dVar21 * dVar36;
          dVar20 = dVar21 * 1.1428571428571428 *
                   ((dVar20 * dVar20 * dVar21 * -122880.0 +
                    dVar20 * dVar37 * 3840.0 +
                    dVar21 * dVar20 * -576.0 + dVar21 * -8.0 + dVar37 * 256.0) * dVar25 +
                   (dVar36 * 60.0 + -2.0) * 3.5449077018110318 * dVar61 +
                   (dVar36 * dVar20 * 5120.0 + dVar20 * -1440.0 + dVar36 * 224.0 + -35.0) *
                   dVar37 * 24.0) + 1.0;
        }
        dVar21 = 0.0;
        if (dVar26 < dVar15) {
          dVar26 = 1.0 / (dVar24 * dVar24);
          dVar21 = (double)(-(ulong)(dVar46 <= dVar16) & (ulong)(dVar16 * dVar17) |
                           ~-(ulong)(dVar46 <= dVar16) & (ulong)(dVar18 * dVar46)) * dVar19 *
                   -0.36927938319101117 *
                   ((dVar55 * 0.04229627833333333 +
                    local_158 * -0.14554132 * (dVar54 / dVar15) + dVar35) * local_1b8 *
                    0.43209876543209874 * dVar23 * dVar26 + local_1f8 * (1.0 / dVar24) +
                   dVar55 * dVar26 * dVar20 * 1.8171205928321397 * dVar22 * 0.026329605555555555);
        }
        dVar26 = p->dens_threshold;
        dVar20 = dVar33;
        if (dVar16 < dVar74) {
          dVar20 = (double)((ulong)dVar81 & uVar12 | ~uVar12 & (ulong)(dVar70 * -(dVar15 - __x)));
        }
        dVar20 = dVar20 + 1.0;
        uVar12 = -(ulong)(dVar20 <= p->zeta_threshold);
        dVar18 = cbrt(dVar20);
        dVar24 = __x * __x;
        dVar15 = cbrt(__x);
        dVar46 = 1.0 / (dVar15 * dVar15);
        dVar54 = (dVar46 / dVar24) * local_1e0;
        dVar24 = local_1e0 * local_1e0 * dVar47 * ((1.0 / dVar15) / (dVar24 * dVar24 * __x)) +
                 dVar23 * 0.1504548888888889 * dVar54 + 1.0;
        dVar15 = pow(dVar24,0.1);
        dVar25 = (double)((ulong)dVar33 & uVar11 |
                         ~uVar11 & ((~uVar13 & (ulong)dVar73 | uVar13 & (ulong)dVar33) ^
                                   0x8000000000000000)) + 1.0;
        uVar11 = -(ulong)(dVar25 <= p->zeta_threshold);
        dVar25 = cbrt(dVar25);
        auVar41._8_8_ = uVar11 & (ulong)dVar17 | ~uVar11 & (ulong)dVar25;
        auVar41._0_8_ = dVar15;
        auVar27 = divpd(_DAT_00f54940,auVar41);
        dVar25 = (dVar34 * auVar27._8_8_ * auVar27._0_8_) / 18.0;
        dVar15 = 1e-10;
        if (1e-10 <= dVar25) {
          dVar15 = dVar25;
        }
        dVar25 = 1.35;
        if (dVar15 <= 1.35) {
          dVar25 = dVar15;
        }
        dVar33 = erf((1.0 / dVar25) * 0.5);
        dVar34 = exp((-1.0 / (dVar25 * dVar25)) * 0.25);
        if (1.35 <= dVar15) {
          dVar25 = dVar15;
          if (dVar15 <= 1.35) {
            dVar25 = 1.35;
          }
          auVar29._0_8_ = dVar25 * dVar25;
          dVar25 = auVar29._0_8_ * auVar29._0_8_;
          auVar29._8_8_ = dVar25;
          dVar33 = dVar25 * dVar25;
          auVar58._0_8_ = auVar29._0_8_ * dVar25;
          auVar58._8_8_ = dVar33 * dVar33;
          auVar27 = divpd(_DAT_00f54940,auVar29);
          auVar78 = divpd(auVar27,_DAT_00f60be0);
          auVar50._8_8_ = dVar33;
          auVar50._0_8_ = auVar58._0_8_;
          auVar68 = divpd(_DAT_00f54940,auVar50);
          uVar69 = auVar68._8_8_;
          auVar42._8_8_ = 0x3ff0000000000000;
          auVar42._0_8_ = uVar69;
          auVar27 = divpd(auVar42,auVar58);
          auVar51._8_8_ = uVar69;
          auVar51._0_8_ = uVar69;
          auVar84 = divpd(auVar51,auVar29);
          auVar68 = divpd(auVar68,_DAT_00f60bf0);
          auVar84 = divpd(auVar84,_DAT_00f60c00);
          auVar27 = divpd(auVar27,_DAT_00f60c10);
          local_1f8 = ((((((auVar78._0_8_ - auVar78._8_8_) + auVar68._0_8_) - auVar68._8_8_) +
                        auVar84._0_8_) - auVar84._8_8_) + auVar27._0_8_) - auVar27._8_8_;
        }
        else {
          local_1f8 = dVar25 * -2.6666666666666665 *
                      (dVar33 * 1.7724538509055159 +
                      (dVar34 + -1.5 + (dVar34 + -1.0) * dVar25 * dVar25 * -2.0) * (dVar25 + dVar25)
                      ) + 1.0;
        }
        dVar25 = pow(dVar24,0.2);
        dVar24 = 0.27;
        if (dVar15 <= 0.27) {
          dVar24 = dVar15;
        }
        dVar47 = dVar24 * dVar24;
        dVar33 = exp((-1.0 / dVar47) * 0.25);
        dVar34 = erf((1.0 / dVar24) * 0.5);
        if (0.27 <= dVar15) {
          dVar24 = dVar15;
          if (dVar15 <= 0.27) {
            dVar24 = 0.27;
          }
          auVar52._0_8_ = dVar24 * dVar24;
          auVar43._0_8_ = auVar52._0_8_ * auVar52._0_8_;
          auVar30._0_8_ = auVar52._0_8_ * auVar43._0_8_;
          auVar30._8_8_ = auVar43._0_8_ * auVar43._0_8_;
          auVar65._0_8_ = auVar43._0_8_ * auVar30._8_8_;
          auVar65._8_8_ = auVar30._0_8_ * auVar30._8_8_;
          dVar24 = auVar30._8_8_ * auVar30._8_8_;
          auVar72._0_8_ = auVar52._0_8_ * auVar30._8_8_;
          auVar72._8_8_ = auVar52._0_8_ * dVar24;
          auVar88._0_8_ = 1.0 / (dVar24 * dVar24);
          auVar59._8_8_ = 0x3ff0000000000000;
          auVar59._0_8_ = auVar88._0_8_;
          auVar76._8_8_ = 0x3ff0000000000000;
          auVar76._0_8_ = auVar88._0_8_;
          auVar5._8_8_ = dVar24;
          auVar5._0_8_ = auVar30._8_8_;
          auVar68 = divpd(auVar76,auVar5);
          dVar24 = auVar68._8_8_;
          auVar94._0_8_ = -dVar24;
          auVar94._8_8_ = dVar24;
          auVar27 = divpd(auVar94,auVar30);
          auVar95 = divpd(auVar27,_DAT_00fc3020);
          auVar96._8_8_ = auVar72._0_8_;
          auVar96._0_8_ = auVar65._0_8_;
          auVar101._8_8_ = dVar24;
          auVar101._0_8_ = dVar24;
          auVar27 = divpd(auVar101,auVar96);
          auVar102 = divpd(auVar27,_DAT_00fc3030);
          auVar97._8_8_ = dVar24 / auVar65._8_8_;
          auVar97._0_8_ = auVar88._0_8_;
          auVar98 = divpd(auVar97,_DAT_00fc3040);
          auVar88._8_8_ = auVar88._0_8_;
          auVar27 = divpd(auVar88,auVar65);
          auVar90 = divpd(auVar27,_DAT_00fc3050);
          auVar52._8_8_ = auVar72._0_8_;
          auVar80._8_8_ = 0x3ff0000000000000;
          auVar80._0_8_ = auVar88._0_8_;
          auVar27 = divpd(auVar80,auVar52);
          auVar85 = divpd(auVar27,_DAT_00fc3060);
          auVar43._8_8_ = auVar65._0_8_;
          auVar53._8_8_ = 0x3ff0000000000000;
          auVar53._0_8_ = auVar88._0_8_;
          auVar27 = divpd(auVar53,auVar43);
          auVar84 = divpd(auVar27,_DAT_00fc3070);
          auVar66._8_8_ = auVar65._8_8_;
          auVar66._0_8_ = auVar30._0_8_;
          auVar31._8_8_ = 0x3ff0000000000000;
          auVar31._0_8_ = auVar88._0_8_;
          auVar27 = divpd(auVar31,auVar66);
          auVar27 = divpd(auVar27,_DAT_00fc3080);
          auVar78 = divpd(auVar68,_DAT_00fc3090);
          auVar68 = divpd(auVar59,auVar72);
          auVar68 = divpd(auVar68,_DAT_00fc30a0);
          local_198 = auVar68._8_8_ +
                      auVar78._8_8_ +
                      auVar27._8_8_ +
                      auVar84._8_8_ +
                      auVar85._8_8_ +
                      (1.0 / auVar30._8_8_) * 3.804788961038961e-06 +
                      (1.0 / auVar30._0_8_) / -11520.0 +
                      0.0013392857142857143 / auVar43._0_8_ + (auVar90._0_8_ - auVar90._8_8_) +
                      (dVar24 / auVar43._0_8_) / 927028425523200.0 +
                      auVar68._0_8_ +
                      auVar78._0_8_ +
                      auVar27._0_8_ +
                      auVar84._0_8_ +
                      auVar85._0_8_ +
                      ((((auVar95._8_8_ + auVar95._0_8_) - auVar102._8_8_) + auVar102._0_8_) -
                      auVar98._8_8_) + auVar98._0_8_;
        }
        else {
          dVar55 = dVar47 * dVar47 * 64.0;
          local_198 = dVar47 * 24.0 *
                      (dVar47 * -36.0 +
                       dVar24 * 17.724538509055158 * dVar34 + (dVar47 * 20.0 - dVar55) * dVar33 +
                       dVar55 + -3.0) + 1.0;
        }
        dVar24 = 0.32;
        if (dVar15 <= 0.32) {
          dVar24 = dVar15;
        }
        dVar47 = dVar24 * dVar24;
        dVar33 = exp((-1.0 / dVar47) * 0.25);
        dVar34 = erf((1.0 / dVar24) * 0.5);
        if (0.32 <= dVar15) {
          if (dVar15 <= 0.32) {
            dVar15 = 0.32;
          }
          dVar15 = dVar15 * dVar15;
          dVar24 = dVar15 * dVar15;
          dVar33 = dVar15 * dVar24;
          auVar32._8_8_ = dVar33;
          auVar32._0_8_ = dVar24;
          auVar44._0_8_ = dVar24 * dVar24;
          dVar34 = auVar44._0_8_ * auVar44._0_8_;
          auVar67._0_8_ = 1.0 / dVar34;
          auVar67._8_8_ = auVar67._0_8_;
          auVar83._8_8_ = auVar67._0_8_;
          auVar83._0_8_ = auVar67._0_8_;
          auVar89._8_8_ = auVar67._0_8_;
          auVar89._0_8_ = auVar67._0_8_;
          auVar4._8_8_ = auVar44._0_8_ * dVar33;
          auVar4._0_8_ = auVar44._0_8_ * dVar24;
          auVar27 = divpd(auVar67,auVar4);
          auVar77._8_8_ = auVar67._0_8_ / dVar15;
          auVar77._0_8_ = auVar67._0_8_;
          auVar78 = divpd(auVar77,_DAT_00fc30b0);
          auVar84 = divpd(auVar83,auVar32);
          auVar85 = divpd(auVar84,_DAT_00fc30c0);
          auVar44._8_8_ = dVar15 * auVar44._0_8_;
          auVar84 = divpd(auVar89,auVar44);
          auVar90 = divpd(auVar84,_DAT_00fc30d0);
          auVar68 = divpd(auVar27,_DAT_00fc30e0);
          auVar45._0_8_ = 1.0 / (dVar34 * dVar34);
          auVar60._8_8_ = auVar45._0_8_ / dVar15;
          auVar60._0_8_ = auVar45._0_8_;
          auVar84 = divpd(auVar60,_DAT_00fc30f0);
          auVar45._8_8_ = auVar45._0_8_;
          auVar27 = divpd(auVar45,auVar32);
          auVar27 = divpd(auVar27,_DAT_00fc3100);
          dVar15 = ((((((((((((1.0 / (auVar44._0_8_ * dVar33)) / -115811942400.0 +
                              (1.0 / (auVar44._0_8_ * dVar24)) / 2530344960.0 +
                              (1.0 / (dVar15 * auVar44._0_8_)) / -61501440.0 +
                              (1.0 / auVar44._0_8_) * 5.871587902837903e-07 +
                              (1.0 / dVar33) / -56448.0 + 0.0003826530612244898 / dVar24 +
                             auVar78._0_8_) - auVar78._8_8_) + auVar85._0_8_) - auVar85._8_8_) +
                         auVar90._0_8_) - auVar90._8_8_) + auVar68._0_8_) - auVar68._8_8_) +
                     auVar84._0_8_) - auVar84._8_8_) + auVar27._0_8_) - auVar27._8_8_;
        }
        else {
          dVar15 = dVar47 * dVar47;
          dVar55 = dVar24 * dVar47;
          dVar15 = dVar24 * 1.1428571428571428 *
                   ((dVar15 * dVar15 * dVar24 * -122880.0 +
                    dVar15 * dVar55 * 3840.0 +
                    dVar24 * dVar15 * -576.0 + dVar24 * -8.0 + dVar55 * 256.0) * dVar33 +
                   (dVar47 * 60.0 + -2.0) * 3.5449077018110318 * dVar34 +
                   (dVar47 * dVar15 * 5120.0 + dVar15 * -1440.0 + dVar47 * 224.0 + -35.0) *
                   dVar55 * 24.0) + 1.0;
        }
        dVar24 = 0.0;
        if (dVar26 < __x) {
          dVar26 = 1.0 / (dVar25 * dVar25);
          dVar24 = dVar19 * (double)((ulong)(dVar16 * dVar17) & uVar12 |
                                    ~uVar12 & (ulong)(dVar20 * dVar18)) * -0.36927938319101117 *
                   ((dVar54 * 0.04229627833333333 +
                    local_118 * -0.14554132 * (dVar46 / __x) + dVar35) * local_198 *
                    0.43209876543209874 * dVar23 * dVar26 + local_1f8 * (1.0 / dVar25) +
                   dVar54 * dVar26 * dVar22 * dVar15 * 1.8171205928321397 * 0.026329605555555555);
        }
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar7 = (long)(p->dim).zk * sVar9;
          pdVar3[lVar7] = dVar21 + dVar24 + pdVar3[lVar7];
        }
      }
      sVar9 = sVar9 + 1;
    } while (np != sVar9);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}